

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.h
# Opt level: O0

uint32_t __thiscall re2c::Enc::nCodeUnits(Enc *this)

{
  type_t tVar1;
  Enc *this_local;
  
  tVar1 = this->type_;
  if (EBCDIC < tVar1) {
    if (tVar1 - UCS2 < 2) {
      return 0x10000;
    }
    if ((tVar1 == UTF32) || (tVar1 != UTF8)) {
      return 0x110000;
    }
  }
  return 0x100;
}

Assistant:

inline uint32_t Enc::nCodeUnits() const
{
	switch (type_)
	{
		case ASCII:
		case EBCDIC:
		case UTF8:	return 0x100;
		case UCS2:
		case UTF16:	return 0x10000;
		case UTF32:
		default:	return 0x110000;
	}
}